

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenGlobalInitializer.cxx
# Opt level: O2

void __thiscall cmQtAutoGenGlobalInitializer::Keywords::Keywords(Keywords *this)

{
  allocator<char> local_76;
  allocator<char> local_75;
  allocator<char> local_74;
  allocator<char> local_73;
  allocator<char> local_72;
  allocator<char> local_71;
  allocator<char> local_70;
  allocator<char> local_6f;
  allocator<char> local_6e;
  allocator<char> local_6d;
  allocator<char> local_6c;
  allocator<char> local_6b;
  allocator<char> local_6a;
  allocator<char> local_69;
  string *local_68;
  string *local_60;
  string *local_58;
  string *local_50;
  string *local_48;
  string *local_40;
  string *local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)this,"AUTOMOC",&local_69);
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->AUTOUIC,"AUTOUIC",&local_6a);
  local_38 = &this->AUTOUIC;
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->AUTORCC,"AUTORCC",&local_6b);
  local_40 = &this->AUTORCC;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->AUTOMOC_EXECUTABLE,"AUTOMOC_EXECUTABLE",&local_6c);
  local_48 = &this->AUTOMOC_EXECUTABLE;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->AUTOUIC_EXECUTABLE,"AUTOUIC_EXECUTABLE",&local_6d);
  local_50 = &this->AUTOUIC_EXECUTABLE;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->AUTORCC_EXECUTABLE,"AUTORCC_EXECUTABLE",&local_6e);
  local_60 = &this->SKIP_AUTOGEN;
  local_58 = &this->AUTORCC_EXECUTABLE;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_60,"SKIP_AUTOGEN",&local_6f);
  local_68 = &this->SKIP_AUTOMOC;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_68,"SKIP_AUTOMOC",&local_70);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->SKIP_AUTOUIC,"SKIP_AUTOUIC",&local_71);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->SKIP_AUTORCC,"SKIP_AUTORCC",&local_72);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->AUTOUIC_OPTIONS,"AUTOUIC_OPTIONS",&local_73);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->AUTORCC_OPTIONS,"AUTORCC_OPTIONS",&local_74);
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->qrc,"qrc",&local_75);
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->ui,"ui",&local_76);
  return;
}

Assistant:

cmQtAutoGenGlobalInitializer::Keywords::Keywords()
  : AUTOMOC("AUTOMOC")
  , AUTOUIC("AUTOUIC")
  , AUTORCC("AUTORCC")
  , AUTOMOC_EXECUTABLE("AUTOMOC_EXECUTABLE")
  , AUTOUIC_EXECUTABLE("AUTOUIC_EXECUTABLE")
  , AUTORCC_EXECUTABLE("AUTORCC_EXECUTABLE")
  , SKIP_AUTOGEN("SKIP_AUTOGEN")
  , SKIP_AUTOMOC("SKIP_AUTOMOC")
  , SKIP_AUTOUIC("SKIP_AUTOUIC")
  , SKIP_AUTORCC("SKIP_AUTORCC")
  , AUTOUIC_OPTIONS("AUTOUIC_OPTIONS")
  , AUTORCC_OPTIONS("AUTORCC_OPTIONS")
  , qrc("qrc")
  , ui("ui")
{
}